

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<solitaire::geometry::Position_()>::Action
          (Action<solitaire::geometry::Position_()> *this,
          ActionInterface<solitaire::geometry::Position_()> *impl)

{
  __shared_ptr<testing::ActionInterface<solitaire::geometry::Position()>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<solitaire::geometry::Position()>,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<testing::ActionInterface<solitaire::geometry::Position()>,void>(local_20,impl);
  std::function<solitaire::geometry::Position()>::
  function<testing::Action<solitaire::geometry::Position()>::ActionAdapter,void>
            ((function<solitaire::geometry::Position()> *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}